

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Cnf_SpecialDataLift(Cnf_Dat_t *p,int nVarsPlus,int firstPiVar,int lastPiVar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 < p->nLiterals; lVar4 = lVar4 + 1) {
    iVar1 = (*p->pClauses)[lVar4];
    iVar2 = iVar1 / 2;
    iVar3 = nVarsPlus * 2;
    if (iVar2 < lastPiVar) {
      iVar3 = firstPiVar * -2;
    }
    if (iVar2 < firstPiVar) {
      iVar3 = nVarsPlus * 2;
    }
    (*p->pClauses)[lVar4] = iVar3 + iVar1;
  }
  return;
}

Assistant:

void Cnf_SpecialDataLift( Cnf_Dat_t * p, int nVarsPlus, int firstPiVar, int lastPiVar)
{
    int v, var;
    for ( v = 0; v < p->nLiterals; v++ )
    {
        var = p->pClauses[0][v] / 2;
        if (var < firstPiVar || var >= lastPiVar)
            p->pClauses[0][v] += 2*nVarsPlus;
        else 
            p->pClauses[0][v] -= 2*firstPiVar;
    }
}